

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
CompilerContext::compile_command(CompilerContext *this,SyntaxTree *command_node,bool not_flag)

{
  vtable_type *pvVar1;
  Command *command;
  undefined8 *puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  type_info *ptVar5;
  pointer_____offset_0x10___ *ppuVar6;
  reference_wrapper<const_Command> command_00;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000011;
  Command *pCVar9;
  Command *extraout_RDX;
  Command *extraout_RDX_00;
  Command *extraout_RDX_01;
  Command *extraout_RDX_02;
  Command *extraout_RDX_03;
  Command *extraout_RDX_04;
  Command *extraout_RDX_05;
  ArgList *__return_storage_ptr__;
  shared_ptr<Label> local_68;
  ArgList local_58;
  ArgList local_40;
  
  pCVar9 = (Command *)CONCAT71(in_register_00000011,not_flag);
  pvVar1 = (command_node->udata).vtable;
  if ((pvVar1 == (vtable_type *)0x0) ||
     (ptVar5 = (*pvVar1->type)(), pCVar9 = extraout_RDX,
     ptVar5 != (type_info *)&DummyCommandAnnotation::typeinfo)) {
    pvVar1 = (command_node->udata).vtable;
    if ((pvVar1 == (vtable_type *)0x0) ||
       (ptVar5 = (*pvVar1->type)(), pCVar9 = extraout_RDX_00,
       ptVar5 != (type_info *)&ReplacedCommandAnnotation::typeinfo)) {
      puVar7 = (undefined8 *)0x0;
    }
    else {
      puVar7 = (undefined8 *)(command_node->udata).storage.dynamic;
    }
    if (puVar7 == (undefined8 *)0x0) {
      command_00 = SyntaxTree::annotation<std::reference_wrapper<Command_const>>(command_node);
      pCVar9 = extraout_RDX_01;
      if (((this->commands->skip_cutscene_end).ref == command_00._M_data) &&
         (peVar3 = (this->label_skip_cutscene_end).
                   super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         peVar3 != (element_type *)0x0)) {
        local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
        std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                  ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,&local_68);
        pCVar9 = extraout_RDX_03;
        if (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
          pCVar9 = extraout_RDX_04;
        }
        p_Var4 = (this->label_skip_cutscene_end).
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        (this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          pCVar9 = extraout_RDX_05;
        }
      }
      __return_storage_ptr__ = &local_58;
      get_args(__return_storage_ptr__,this,pCVar9,command_node);
      compile_command(this,command_00._M_data,__return_storage_ptr__,not_flag);
    }
    else {
      command = (Command *)*puVar7;
      if ((this->commands->skip_cutscene_start_internal).ref == command) {
        puVar2 = (undefined8 *)puVar7[1];
        puVar8 = (undefined8 *)puVar2[2];
        if (puVar8 == (undefined8 *)0x0) {
          puVar8 = (undefined8 *)0x0;
        }
        else {
          ppuVar6 = (pointer_____offset_0x10___ *)(*(code *)*puVar8)();
          puVar8 = (undefined8 *)0x0;
          if (ppuVar6 == &std::shared_ptr<Label>::typeinfo) {
            puVar8 = puVar2;
          }
        }
        if (puVar8 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = &PTR__bad_cast_00219e10;
          __cxa_throw(puVar7,&linb::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        pCVar9 = (Command *)*puVar8;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[1];
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)pCVar9;
        this_00 = (this->label_skip_cutscene_end).
                  super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          pCVar9 = extraout_RDX_02;
        }
      }
      __return_storage_ptr__ = &local_40;
      get_args(__return_storage_ptr__,this,pCVar9,
               (vector<linb::any,_std::allocator<linb::any>_> *)(puVar7 + 1));
      compile_command(this,command,__return_storage_ptr__,false);
    }
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return;
}

Assistant:

void CompilerContext::compile_command(const SyntaxTree& command_node, bool not_flag)
{
    if(command_node.maybe_annotation<DummyCommandAnnotation>())
    {
        // compile nothing
    }
    else if(auto opt_annot = command_node.maybe_annotation<const ReplacedCommandAnnotation&>())
    {
        const Command& command = opt_annot->command;

        if(commands.equal(command, commands.skip_cutscene_start_internal))
        {
            this->label_skip_cutscene_end = any_cast<shared_ptr<Label>>(opt_annot->params[0]);
        }

        compile_command(command, get_args(opt_annot->command, opt_annot->params));
    }
    else
    {
        const Command& command = command_node.annotation<std::reference_wrapper<const Command>>();

        if(commands.equal(command, commands.skip_cutscene_end) && this->label_skip_cutscene_end)
        {
            compile_label(this->label_skip_cutscene_end);
            this->label_skip_cutscene_end = nullptr;
        }

        compile_command(command, get_args(command, command_node), not_flag);
    }
}